

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int * __thiscall
JsUtil::
BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  int *piVar1;
  
  piVar1 = Memory::
           AllocateArray<Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator,int,false>
                     ((Memory *)this->alloc,
                      (DictAllocator *)
                      Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator::Alloc,0,
                      (ulong)bucketCount);
  return piVar1;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }